

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_chacha20_poly1305_hw.c
# Opt level: O0

int chacha_poly1305_tls_init(PROV_CIPHER_CTX *bctx,uchar *aad,size_t alen)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  PROV_CHACHA20_POLY1305_CTX *ctx;
  uint len;
  size_t alen_local;
  uchar *aad_local;
  PROV_CIPHER_CTX *bctx_local;
  int local_4;
  
  if (alen == 0xd) {
    *(undefined8 *)((long)&bctx[4].stream + 4) = *(undefined8 *)aad;
    uVar1 = aad[9];
    uVar2 = aad[10];
    uVar3 = aad[0xb];
    bctx[4].field_0x14 = aad[8];
    bctx[4].field_0x15 = uVar1;
    bctx[4].field_0x16 = uVar2;
    bctx[4].field_0x17 = uVar3;
    *(uchar *)&bctx[4].keylen = aad[0xc];
    len = (uint)CONCAT11(aad[0xb],aad[0xc]);
    if (((byte)bctx->field_0x3c >> 1 & 1) == 0) {
      if (len < 0x10) {
        return 0;
      }
      len = len - 0x10;
      bctx[4].field_0x17 = (char)(len >> 8);
      *(char *)&bctx[4].keylen = (char)len;
    }
    bctx[4].tlsmac = (uchar *)(ulong)len;
    *(undefined4 *)((long)&bctx[2].ivlen + 4) = *(undefined4 *)&bctx[3].ks;
    *(uint *)&bctx[2].blocksize =
         *(uint *)((long)&bctx[3].ks + 4) ^ *(uint *)((long)&bctx[4].stream + 4);
    *(uint *)((long)&bctx[2].blocksize + 4) = *(uint *)&bctx[3].libctx ^ bctx[4].mode;
    *(byte *)&bctx[4].bufsz = (byte)bctx[4].bufsz & 0xfd;
    local_4 = 0x10;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int chacha_poly1305_tls_init(PROV_CIPHER_CTX *bctx,
                                    unsigned char *aad, size_t alen)
{
    unsigned int len;
    PROV_CHACHA20_POLY1305_CTX *ctx = (PROV_CHACHA20_POLY1305_CTX *)bctx;

    if (alen != EVP_AEAD_TLS1_AAD_LEN)
        return 0;

    memcpy(ctx->tls_aad, aad, EVP_AEAD_TLS1_AAD_LEN);
    len = aad[EVP_AEAD_TLS1_AAD_LEN - 2] << 8 | aad[EVP_AEAD_TLS1_AAD_LEN - 1];
    aad = ctx->tls_aad;
    if (!bctx->enc) {
        if (len < POLY1305_BLOCK_SIZE)
            return 0;
        len -= POLY1305_BLOCK_SIZE; /* discount attached tag */
        aad[EVP_AEAD_TLS1_AAD_LEN - 2] = (unsigned char)(len >> 8);
        aad[EVP_AEAD_TLS1_AAD_LEN - 1] = (unsigned char)len;
    }
    ctx->tls_payload_length = len;

    /* merge record sequence number as per RFC7905 */
    ctx->chacha.counter[1] = ctx->nonce[0];
    ctx->chacha.counter[2] = ctx->nonce[1] ^ CHACHA_U8TOU32(aad);
    ctx->chacha.counter[3] = ctx->nonce[2] ^ CHACHA_U8TOU32(aad+4);
    ctx->mac_inited = 0;

    return POLY1305_BLOCK_SIZE;         /* tag length */
}